

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O1

int jas_stream_isseekable(jas_stream_t *stream)

{
  long lVar1;
  
  if (stream->ops_ == &jas_stream_memops) {
    return 1;
  }
  if (stream->ops_ != &jas_stream_fileops) {
    return 0;
  }
  lVar1 = file_seek(stream->obj_,0,1);
  return (int)(-1 < lVar1);
}

Assistant:

int jas_stream_isseekable(jas_stream_t *stream)
{
	if (stream->ops_ == &jas_stream_memops) {
		return 1;
	} else if (stream->ops_ == &jas_stream_fileops) {
		if ((*stream->ops_->seek_)(stream->obj_, 0, SEEK_CUR) < 0) {
			return 0;
		}
		return 1;
	} else {
		return 0;
	}
}